

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O1

UnicodeString *
icu_63::ZoneMeta::formatCustomID
          (uint8_t hour,uint8_t min,uint8_t sec,UBool negative,UnicodeString *id)

{
  short sVar1;
  undefined8 in_RAX;
  int32_t length;
  undefined7 in_register_00000031;
  ulong uVar2;
  undefined7 in_register_00000039;
  ulong uVar3;
  undefined8 uStack_38;
  
  uVar3 = CONCAT71(in_register_00000039,hour);
  uVar2 = CONCAT71(in_register_00000031,min);
  uStack_38 = in_RAX;
  icu_63::UnicodeString::unBogus(id);
  sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (id->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  icu_63::UnicodeString::doReplace(id,0,length,L"GMT",0,-1);
  if ((int)uVar2 != 0 || (int)uVar3 != 0) {
    if (negative == '\0') {
      uStack_38 = CONCAT26(0x2b,(undefined6)uStack_38);
    }
    else {
      uStack_38 = CONCAT26(0x2d,(undefined6)uStack_38);
    }
    icu_63::UnicodeString::doAppend(id,(UChar *)((long)&uStack_38 + 6),0,1);
    uStack_38 = CONCAT26((short)((ulong)(uint)((int)uVar3 +
                                              (int)((uVar3 & 0xffffffff) * 0x28f5c29 >> 0x20) * -100
                                              ) * 0x1999999a >> 0x20),(undefined6)uStack_38) |
                0x30000000000000;
    icu_63::UnicodeString::doAppend(id,(UChar *)((long)&uStack_38 + 6),0,1);
    uStack_38 = CONCAT26((short)uVar3 + (short)((uVar3 & 0xffffffff) * 0x1999999a >> 0x20) * -10,
                         (undefined6)uStack_38) | 0x30000000000000;
    icu_63::UnicodeString::doAppend(id,(UChar *)((long)&uStack_38 + 6),0,1);
    uStack_38 = CONCAT26(0x3a,(undefined6)uStack_38);
    icu_63::UnicodeString::doAppend(id,(UChar *)((long)&uStack_38 + 6),0,1);
    uStack_38 = CONCAT26((short)((ulong)(uint)((int)uVar2 +
                                              (int)((uVar2 & 0xffffffff) * 0x28f5c29 >> 0x20) * -100
                                              ) * 0x1999999a >> 0x20),(undefined6)uStack_38) |
                0x30000000000000;
    icu_63::UnicodeString::doAppend(id,(UChar *)((long)&uStack_38 + 6),0,1);
    uStack_38 = CONCAT26((short)uVar2 + (short)((uVar2 & 0xffffffff) * 0x1999999a >> 0x20) * -10,
                         (undefined6)uStack_38) | 0x30000000000000;
    icu_63::UnicodeString::doAppend(id,(UChar *)((long)&uStack_38 + 6),0,1);
    if (sec != '\0') {
      uStack_38 = CONCAT26(0x3a,(undefined6)uStack_38);
      icu_63::UnicodeString::doAppend(id,(UChar *)((long)&uStack_38 + 6),0,1);
      uStack_38 = CONCAT26((short)((ulong)((uint)sec + (sec / 100) * -100) * 0x1999999a >> 0x20),
                           (undefined6)uStack_38) | 0x30000000000000;
      icu_63::UnicodeString::doAppend(id,(UChar *)((long)&uStack_38 + 6),0,1);
      uStack_38 = CONCAT26((ushort)sec + (sec / 10) * -10,(undefined6)uStack_38) | 0x30000000000000;
      icu_63::UnicodeString::doAppend(id,(UChar *)((long)&uStack_38 + 6),0,1);
    }
  }
  return id;
}

Assistant:

UnicodeString&
ZoneMeta::formatCustomID(uint8_t hour, uint8_t min, uint8_t sec, UBool negative, UnicodeString& id) {
    // Create normalized time zone ID - GMT[+|-]HH:mm[:ss]
    id.setTo(gCustomTzPrefix, -1);
    if (hour != 0 || min != 0) {
        if (negative) {
          id.append((UChar)0x2D);    // '-'
        } else {
          id.append((UChar)0x2B);    // '+'
        }
        // Always use US-ASCII digits
        id.append((UChar)(0x30 + (hour%100)/10));
        id.append((UChar)(0x30 + (hour%10)));
        id.append((UChar)0x3A);    // ':'
        id.append((UChar)(0x30 + (min%100)/10));
        id.append((UChar)(0x30 + (min%10)));
        if (sec != 0) {
          id.append((UChar)0x3A);    // ':'
          id.append((UChar)(0x30 + (sec%100)/10));
          id.append((UChar)(0x30 + (sec%10)));
        }
    }
    return id;
}